

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectionAddressFilter.cpp
# Opt level: O1

KBOOL __thiscall
KDIS::NETWORK::ConnectionAddressFilter::OnDataReceived
          (ConnectionAddressFilter *this,KOCTET *Data,KUINT32 DataLength,KString *SenderIp)

{
  iterator iVar1;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->m_Filter)._M_t,SenderIp);
  return (this->m_FM == AllowAddressesInFilterList) !=
         ((_Rb_tree_header *)iVar1._M_node == &(this->m_Filter)._M_t._M_impl.super__Rb_tree_header);
}

Assistant:

KBOOL ConnectionAddressFilter::OnDataReceived( const KOCTET * Data, KUINT32 DataLength, const KString & SenderIp )
{
	return TestAddress( SenderIp );
}